

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoSimdBitSelect(Thread *this)

{
  Simd<unsigned_long,_(unsigned_char)__x02_> SVar1;
  byte local_51;
  unsigned_long uStack_50;
  u8 i;
  S result;
  Simd<unsigned_long,_(unsigned_char)__x02_> lhs;
  Simd<unsigned_long,_(unsigned_char)__x02_> rhs;
  Simd<unsigned_long,_(unsigned_char)__x02_> c;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  SVar1 = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  result.v[1] = SVar1.v[0];
  lhs.v[0] = SVar1.v[1];
  for (local_51 = 0; local_51 < 2; local_51 = local_51 + 1) {
    lhs.v[(ulong)local_51 - 3] =
         result.v[(ulong)local_51 + 1] & rhs.v[(ulong)local_51 + 1] |
         lhs.v[(ulong)local_51 + 1] & (rhs.v[(ulong)local_51 + 1] ^ 0xffffffffffffffff);
  }
  SVar1.v[1] = result.v[0];
  SVar1.v[0] = uStack_50;
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,SVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitSelect() {
  using S = u64x2;
  auto c = Pop<S>();
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = (lhs.v[i] & c.v[i]) | (rhs.v[i] & ~c.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}